

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusplatformmenu.cpp
# Opt level: O0

void __thiscall QDBusPlatformMenu::syncSubMenu(QDBusPlatformMenu *this,QDBusPlatformMenu *menu)

{
  Object *in_RSI;
  long in_FS_OFFSET;
  code *slot;
  ContextType *context;
  offset_in_QDBusPlatformMenu_to_subr in_stack_ffffffffffffffc0;
  Connection local_28 [8];
  ConnectionType type;
  Connection local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  type = 0xb18ca0;
  slot = propertiesUpdated;
  context = (ContextType *)0x0;
  QObject::
  connect<void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>),void(QDBusPlatformMenu::*)(QList<QDBusMenuItem>,QList<QDBusMenuItemKeys>)>
            (in_RSI,in_stack_ffffffffffffffc0,(ContextType *)0x0,
             (offset_in_QDBusPlatformMenu_to_subr *)propertiesUpdated,0xb18ca0);
  QMetaObject::Connection::~Connection(local_10);
  QObject::
  connect<void(QDBusPlatformMenu::*)(unsigned_int,int),void(QDBusPlatformMenu::*)(unsigned_int,int)>
            (in_RSI,in_stack_ffffffffffffffc0,context,(offset_in_QDBusPlatformMenu_to_subr *)slot,
             type);
  QMetaObject::Connection::~Connection(local_28);
  QObject::
  connect<void(QDBusPlatformMenu::*)(int,unsigned_int),void(QDBusPlatformMenu::*)(int,unsigned_int)>
            (in_RSI,in_stack_ffffffffffffffc0,context,(offset_in_QDBusPlatformMenu_to_subr *)slot,
             type);
  QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusPlatformMenu::syncSubMenu(const QDBusPlatformMenu *menu)
{
    // The adaptor is only connected to the propertiesUpdated signal of the top-level
    // menu, so the submenus should transfer their signals to their parents.
    connect(menu, &QDBusPlatformMenu::propertiesUpdated,
            this, &QDBusPlatformMenu::propertiesUpdated, Qt::UniqueConnection);
    connect(menu, &QDBusPlatformMenu::updated,
            this, &QDBusPlatformMenu::updated, Qt::UniqueConnection);
    connect(menu, &QDBusPlatformMenu::popupRequested,
            this, &QDBusPlatformMenu::popupRequested, Qt::UniqueConnection);
}